

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::TypeRefining::updateTypes(wasm::Module&)::TypeRewriter::
modifyStruct(wasm::HeapType,wasm::Struct__(void *this,HeapType oldStructType,Struct *struct_)

{
  Struct *pSVar1;
  StructValues<wasm::LUBFinder> *this_00;
  LUBFinder *pLVar2;
  Type TVar3;
  pointer pFVar4;
  uint uVar5;
  ulong index;
  HeapType local_38;
  HeapType oldStructType_local;
  
  local_38.id = oldStructType.id;
  pSVar1 = HeapType::getStruct(&local_38);
  pFVar4 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; index = (ulong)uVar5,
      index < (ulong)((long)(struct_->fields).
                            super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pFVar4 >> 4);
      uVar5 = uVar5 + 1) {
    TVar3.id = (pSVar1->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start[index].type.id;
    if ((TVar3.id & 1) == 0 && 6 < TVar3.id) {
      this_00 = StructUtils::StructValuesMap<wasm::LUBFinder>::operator[]
                          ((StructValuesMap<wasm::LUBFinder> *)(*(long *)((long)this + 0x68) + 0x60)
                           ,local_38);
      pLVar2 = StructUtils::StructValues<wasm::LUBFinder>::operator[](this_00,index);
      TVar3 = GlobalTypeRewriter::getTempType((GlobalTypeRewriter *)this,(pLVar2->lub).id);
      pFVar4 = (struct_->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pFVar4[index].type.id = TVar3.id;
    }
  }
  return;
}

Assistant:

void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        const auto& oldFields = oldStructType.getStruct().fields;
        auto& newFields = struct_.fields;

        for (Index i = 0; i < newFields.size(); i++) {
          auto oldType = oldFields[i].type;
          if (!oldType.isRef()) {
            continue;
          }
          auto newType = parent.finalInfos[oldStructType][i].getLUB();
          newFields[i].type = getTempType(newType);
        }
      }